

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceThroughComponent_Test::
~Units_flattenImportedUnitsWithNonStandardReferenceThroughComponent_Test
          (Units_flattenImportedUnitsWithNonStandardReferenceThroughComponent_Test *this)

{
  Units_flattenImportedUnitsWithNonStandardReferenceThroughComponent_Test *this_local;
  
  ~Units_flattenImportedUnitsWithNonStandardReferenceThroughComponent_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceThroughComponent)
{
    libcellml::ModelPtr importModel;
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ImportSourcePtr import = createBaseModelImport(importModel, "importer/units/base_model.cellml");

    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::ComponentPtr ic = libcellml::Component::create("my_component");
    ic->setImportSource(import);
    ic->setImportReference("my_component");

    model->addComponent(ic);

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(0), importer->issueCount());
}